

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<float>
          (AsciiParser *this,char sep,vector<float,_std::allocator<float>_> *result)

{
  bool bVar1;
  allocator local_79;
  string local_78;
  float local_58;
  char local_52;
  allocator local_51;
  float value_1;
  char c;
  float local_2c;
  vector<float,_std::allocator<float>_> *pvStack_28;
  float value;
  vector<float,_std::allocator<float>_> *result_local;
  AsciiParser *pAStack_18;
  char sep_local;
  AsciiParser *this_local;
  
  pvStack_28 = result;
  result_local._7_1_ = sep;
  pAStack_18 = this;
  ::std::vector<float,_std::allocator<float>_>::clear(result);
  bVar1 = SkipWhitespaceAndNewline(this,true);
  if (bVar1) {
    bVar1 = ReadBasicType(this,&local_2c);
    if (bVar1) {
      ::std::vector<float,_std::allocator<float>_>::push_back(pvStack_28,&local_2c);
      while (bVar1 = Eof(this), ((bVar1 ^ 0xffU) & 1) != 0) {
        bVar1 = SkipWhitespaceAndNewline(this,true);
        if (!bVar1) {
          return false;
        }
        bVar1 = Char1(this,&local_52);
        if (!bVar1) {
          return false;
        }
        if (local_52 != result_local._7_1_) {
          StreamReader::seek_from_current(this->_sr,-1);
          break;
        }
        bVar1 = SkipWhitespaceAndNewline(this,true);
        if (!bVar1) {
          return false;
        }
        bVar1 = ReadBasicType(this,&local_58);
        if (!bVar1) break;
        ::std::vector<float,_std::allocator<float>_>::push_back(pvStack_28,&local_58);
      }
      bVar1 = ::std::vector<float,_std::allocator<float>_>::empty(pvStack_28);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_78,"Empty array.\n",&local_79);
        PushError(this,&local_78);
        ::std::__cxx11::string::~string((string *)&local_78);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_79);
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&value_1,"Not starting with the value of requested type.\n",&local_51);
      PushError(this,(string *)&value_1);
      ::std::__cxx11::string::~string((string *)&value_1);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_51);
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    // sep
    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);
  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}